

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.c
# Opt level: O1

int compare_pair(void *a,void *b)

{
  int iVar1;
  
  iVar1 = *(int *)((long)b + 4) - *(int *)((long)a + 4);
  if (iVar1 != 0) {
    return iVar1;
  }
  return *a - *b;
}

Assistant:

int compare_pair(const void* a, const void* b) {
  U32Pair* pa = (U32Pair*)a;
  U32Pair* pb = (U32Pair*)b;
  int dcount = (int)pb->count - (int)pa->count;
  if (dcount != 0) {
    return dcount;
  }
  return (int)pa->value - (int)pb->value;
}